

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O0

fdtd * initializeFdtd2D(uint setupID,float_type *domain_size,float_type Sc,
                       float_type smallest_wavelength,uintmax_t cpml_thickness)

{
  undefined1 auVar1 [16];
  fdtd_source src_00;
  fdtd_source src_01;
  fdtd_source src_02;
  double *in_RDX;
  int in_ESI;
  fdtd *in_RDI;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [64];
  fdtd_source src_2;
  middle_object_2D mo_2;
  fdtd2D fdtd_2;
  border_condition bc_2 [4];
  fdtd_source src_1;
  middle_object_2D mo_1;
  fdtd2D fdtd_1;
  border_condition bc_1 [4];
  uintmax_t j;
  fdtd_source src;
  middle_object_2D mo;
  float_type smallest_dim_size;
  fdtd2D fdtd;
  border_condition bc [4];
  setup2D sID;
  double local_510;
  undefined4 in_stack_fffffffffffffb08;
  init_medium_fun_2D in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  uintmax_t in_stack_fffffffffffffb30;
  border_condition *in_stack_fffffffffffffb38;
  float_type in_stack_fffffffffffffb40;
  undefined1 *puVar5;
  float_type in_stack_fffffffffffffb48;
  undefined8 uVar6;
  float_type *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  undefined1 local_490 [16];
  double local_480;
  undefined8 local_378;
  undefined8 local_370;
  fdtd_source local_360;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined1 local_300 [16];
  double local_2f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  ulong local_1d0;
  fdtd_source local_1c8;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  undefined8 local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160 [2];
  double local_150;
  ulong local_c0;
  double local_a8;
  double local_a0;
  long local_98;
  undefined8 local_48;
  undefined8 local_40;
  double *local_10;
  
  local_10 = in_RDX;
  if (in_ESI == 2) {
    local_378 = 0x500000005;
    local_370 = 0x100000001;
    init_fdtd_2D_cpml(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                      in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    puVar5 = &DAT_3ff0026a83568c29;
    uVar6 = 0x3ffc51eb851eb852;
    dVar2 = *local_10 / 2.0;
    dVar3 = (local_10[1] * 3.0) / 4.0;
    init_fdtd_2D_medium((fdtd2D *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                        (init_medium_fun_2D)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                        (void *)CONCAT44(in_ESI,in_stack_fffffffffffffb08));
    gaussian_source((fdtd_source *)&stack0xfffffffffffffb10,local_480 * 30.0,local_480 * 15.0,1000.0
                   );
    src_02.field_1.field_0.gaussian_pulse_delay = (float_type)uVar6;
    src_02._0_8_ = puVar5;
    src_02.field_1.field_0.gaussian_pulse_peak_time = dVar2;
    src_02.field_1.field_0.gaussian_peak_val = dVar3;
    add_source_fdtd_2D(in_stack_fffffffffffffb24,(fdtd2D *)in_stack_fffffffffffffb18,src_02,
                       (float_type)in_stack_fffffffffffffb10,
                       (float_type)CONCAT44(in_ESI,in_stack_fffffffffffffb08));
    in_RDI->type = fdtd_two_dims;
    memcpy(&in_RDI->field_1,local_490,0x118);
  }
  else if (in_ESI == 3) {
    local_48 = 0x500000005;
    local_40 = 0x100000001;
    init_fdtd_2D_cpml(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                      in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    if (local_a8 <= local_a0) {
      local_510 = local_a8;
    }
    else {
      local_510 = local_a0;
    }
    local_168 = local_510;
    local_1a8 = 0x3ff00000635234d6;
    local_1a0 = 0x3ff0000000000000;
    local_198 = &DAT_3ff0026a83568c29;
    local_190 = 0x41cdcd6500000000;
    local_188 = *local_10 / 2.0;
    local_180 = local_10[1] / 2.0;
    local_178 = local_510 / 2.0;
    local_170 = local_510 / 2.0;
    init_fdtd_2D_medium((fdtd2D *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                        (init_medium_fun_2D)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                        (void *)CONCAT44(in_ESI,in_stack_fffffffffffffb08));
    auVar4 = ZEXT864((ulong)(local_150 * 25.0));
    gaussian_source(&local_1c8,local_150 * 25.0,local_150 * 3.0,100.0);
    for (local_1d0 = local_c0; local_1d0 < local_98 - local_c0; local_1d0 = local_1d0 + 1) {
      auVar1 = vcvtusi2sd_avx512f(auVar4._0_16_,local_1d0);
      auVar4 = ZEXT864((ulong)(auVar1._0_8_ * local_160[0]));
      src_00.field_1.field_0.gaussian_pulse_delay = in_stack_fffffffffffffb48;
      src_00._0_8_ = in_stack_fffffffffffffb40;
      src_00.field_1.field_0.gaussian_pulse_peak_time = (float_type)in_stack_fffffffffffffb50;
      src_00.field_1.field_0.gaussian_peak_val = (float_type)in_stack_fffffffffffffb58;
      add_source_fdtd_2D(in_stack_fffffffffffffb24,(fdtd2D *)in_stack_fffffffffffffb18,src_00,
                         (float_type)in_stack_fffffffffffffb10,
                         (float_type)CONCAT44(in_ESI,in_stack_fffffffffffffb08));
    }
    in_RDI->type = fdtd_two_dims;
    memcpy(&in_RDI->field_1,local_160,0x118);
  }
  else {
    if (in_ESI != 4) {
      fprintf(_stderr,"The specified 1D setup ID is does not exist\n");
      exit(1);
    }
    local_1e8 = 0x500000005;
    local_1e0 = 0x500000005;
    init_fdtd_2D_cpml(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                      in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    memset(&local_340,0,0x40);
    local_340 = 0x3ff0000000000000;
    local_338 = 0x3ff0000000000000;
    local_330 = 0x3ff0000000000000;
    local_328 = 0x3ff0000000000000;
    local_320 = 0xbff0000000000000;
    local_318 = 0xbff0000000000000;
    init_fdtd_2D_medium((fdtd2D *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                        (init_medium_fun_2D)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                        (void *)CONCAT44(in_ESI,in_stack_fffffffffffffb08));
    gaussian_source(&local_360,local_2f0 * 30.0,local_2f0 * 15.0,1.0);
    src_01.field_1.field_0.gaussian_pulse_delay = in_stack_fffffffffffffb48;
    src_01._0_8_ = in_stack_fffffffffffffb40;
    src_01.field_1.field_0.gaussian_pulse_peak_time = (float_type)in_stack_fffffffffffffb50;
    src_01.field_1.field_0.gaussian_peak_val = (float_type)in_stack_fffffffffffffb58;
    add_source_fdtd_2D(in_stack_fffffffffffffb24,(fdtd2D *)in_stack_fffffffffffffb18,src_01,
                       (float_type)in_stack_fffffffffffffb10,
                       (float_type)CONCAT44(in_ESI,in_stack_fffffffffffffb08));
    in_RDI->type = fdtd_two_dims;
    memcpy(&in_RDI->field_1,local_300,0x118);
  }
  return in_RDI;
}

Assistant:

static struct fdtd initializeFdtd2D(unsigned setupID, float_type *domain_size,
                                    float_type Sc,
                                    float_type smallest_wavelength,
                                    uintmax_t cpml_thickness) {
  enum setup2D sID = (enum setup2D)setupID;
  switch (sID) {
  case object_high_permitivity_in_air_west_gaussian_pulse_centered_2D: {
    enum border_condition bc[num_borders_2D] = {
        [border_south] = border_perfect_electric_conductor | border_cpml,
        [border_north] = border_perfect_electric_conductor | border_cpml,
        [border_east] = border_perfect_electric_conductor,
        [border_west] = border_perfect_electric_conductor};
    struct fdtd2D fdtd = init_fdtd_2D_cpml(domain_size, Sc, smallest_wavelength,
                                           bc, cpml_thickness);
    float_type smallest_dim_size = fdtd.domain_size[0] > fdtd.domain_size[1]
                                       ? fdtd.domain_size[1]
                                       : fdtd.domain_size[0];
    struct middle_object_2D mo = {
        .permittivity_medium = float_cst(1.00058986),
        .permittivity_object = float_cst(1e9),
        .permeability_medium = float_cst(1.00000037),
        .permeability_object = float_cst(1.),
        .object_center = {domain_size[0] / float_cst(2.),
                          domain_size[1] / float_cst(2.)},
        .object_dimensions = {smallest_dim_size / float_cst(2.),
                              smallest_dim_size / float_cst(2.)}};
    init_fdtd_2D_medium(&fdtd, init_permeability_object_2D,
                        init_permittivity_object_2D, &mo);

    struct fdtd_source src = gaussian_source(
        float_cst(25.) * fdtd.dt, float_cst(3.) * fdtd.dt, float_cst(100));
    for (uintmax_t j = fdtd.cpml_thickness;
         j < fdtd.sizeX - fdtd.cpml_thickness; ++j) {
      add_source_fdtd_2D(source_electric, &fdtd, src, (float_type)j * fdtd.dx,
                         fdtd.dy);
    }

    struct fdtd retval = {.twoDims = fdtd, .type = fdtd_two_dims};
    return retval;
  }
  case free_space_gaussian_exitation_centered_absorbing_border_2D: {
    enum border_condition bc[num_borders_2D] = {
        [border_south] = border_perfect_electric_conductor | border_cpml,
        [border_north] = border_perfect_electric_conductor | border_cpml,
        [border_east] = border_perfect_electric_conductor | border_cpml,
        [border_west] = border_perfect_electric_conductor | border_cpml};
    struct fdtd2D fdtd = init_fdtd_2D_cpml(domain_size, Sc, smallest_wavelength,
                                           bc, cpml_thickness);

    struct middle_object_2D mo = {
        .permittivity_medium = float_cst(1.),
        .permittivity_object = float_cst(1.),
        .permeability_medium = float_cst(1.),
        .permeability_object = float_cst(1.),
        .object_center = {float_cst(-1.), float_cst(-1.)},
        .object_dimensions = {float_cst(0.), float_cst(0.)}};
    init_fdtd_2D_medium(&fdtd, init_permeability_object_2D,
                        init_permittivity_object_2D, &mo);

    struct fdtd_source src = gaussian_source(
        float_cst(30.) * fdtd.dt, float_cst(15.) * fdtd.dt, float_cst(1.));
    add_source_fdtd_2D(source_electric, &fdtd, src,
                       fdtd.domain_size[0] / float_cst(2.),
                       fdtd.domain_size[1] / float_cst(2.));
    struct fdtd retval = {.twoDims = fdtd, .type = fdtd_two_dims};
    return retval;
  } break;
  case west_air_east_water_west_gaussian_pulse_centered_2D: {
    enum border_condition bc[num_borders_2D] = {
        [border_south] = border_perfect_electric_conductor | border_cpml,
        [border_north] = border_perfect_electric_conductor | border_cpml,
        [border_east] = border_perfect_electric_conductor,
        [border_west] = border_perfect_electric_conductor};
    struct fdtd2D fdtd = init_fdtd_2D_cpml(domain_size, Sc, smallest_wavelength,
                                           bc, cpml_thickness);
    struct middle_object_2D mo = {
        .permittivity_medium = float_cst(1.00058986),
        .permittivity_object = float_cst(1.77),
        .permeability_medium = float_cst(1.00000037),
        .permeability_object = float_cst(0.999992),
        .object_center = {domain_size[0] / float_cst(2.),
                          float_cst(3.) * domain_size[1] / float_cst(4.)},
        .object_dimensions = {domain_size[0] * float_cst(2.),
                              domain_size[1] / float_cst(2.)}};
    init_fdtd_2D_medium(&fdtd, init_permeability_object_2D,
                        init_permittivity_object_2D, &mo);

    struct fdtd_source src = gaussian_source(
        float_cst(30.) * fdtd.dt, float_cst(15.) * fdtd.dt, float_cst(1000.));
    add_source_fdtd_2D(source_electric, &fdtd, src,
                       fdtd.domain_size[0] / float_cst(2.), fdtd.dy);
    struct fdtd retval = {.twoDims = fdtd, .type = fdtd_two_dims};
    return retval;
  } break;
  default:
    fprintf(stderr, "The specified 1D setup ID is does not exist\n");
    exit(EXIT_FAILURE);
  }
}